

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O0

int If_CutDsdLit(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  int *pMap;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  pMap = Vec_IntArray(p->vTtDsds[*(uint *)&pCut->field_0x1c >> 0x18]);
  iVar1 = If_CutTruthLit(pCut);
  iVar1 = Abc_Lit2LitL(pMap,iVar1);
  return iVar1;
}

Assistant:

static inline int        If_CutDsdLit( If_Man_t * p, If_Cut_t * pCut )       { return Abc_Lit2LitL( Vec_IntArray(p->vTtDsds[pCut->nLeaves]), If_CutTruthLit(pCut) );               }